

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter_Postprocess.cpp
# Opt level: O1

size_t __thiscall
Assimp::AMFImporter::PostprocessHelper_GetTextureID_Or_Create
          (AMFImporter *this,string *pID_R,string *pID_G,string *pID_B,string *pID_A)

{
  size_t *psVar1;
  pointer pcVar2;
  size_t __n;
  long lVar3;
  long lVar4;
  pointer puVar5;
  string *pID;
  string *pID_00;
  string *pID_01;
  undefined1 *__s2;
  size_t sVar6;
  int iVar7;
  size_t idx_target;
  long *plVar8;
  runtime_error *prVar9;
  pointer puVar10;
  _Node *p_Var11;
  long *plVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  ulong *puVar14;
  ulong uVar15;
  CAMFImporter_NodeElement_Texture *pCVar16;
  SPP_Texture *pSVar17;
  pointer puVar18;
  ulong uVar19;
  list<Assimp::AMFImporter::SPP_Texture,std::allocator<Assimp::AMFImporter::SPP_Texture>> *plVar20;
  pointer puVar21;
  pointer puVar22;
  pointer puVar23;
  SPP_Texture *pSVar24;
  SPP_Texture *pSVar25;
  bool bVar26;
  CAMFImporter_NodeElement *t_tex;
  vector<CAMFImporter_NodeElement_Texture_*,_std::allocator<CAMFImporter_NodeElement_Texture_*>_>
  src_texture_4check;
  SPP_Texture converted_texture;
  string TextureConverted_ID;
  CAMFImporter_NodeElement_Texture *local_188;
  long local_180;
  undefined1 local_178 [16];
  _Alloc_hider local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  CAMFImporter_NodeElement_Texture *local_140;
  CAMFImporter_NodeElement_Texture *local_138;
  CAMFImporter_NodeElement_Texture *local_130;
  list<Assimp::AMFImporter::SPP_Texture,std::allocator<Assimp::AMFImporter::SPP_Texture>> *local_128
  ;
  SPP_Texture local_120;
  string *local_d0;
  string *local_c8;
  string *local_c0;
  long *local_b8 [2];
  long local_a8 [2];
  CAMFImporter_NodeElement_Texture *local_98;
  long local_90;
  _func_int **local_88;
  long lStack_80;
  undefined1 *local_78;
  size_t local_70;
  undefined1 local_68;
  undefined7 uStack_67;
  size_type local_58;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  local_78 = &local_68;
  local_70 = 0;
  local_68 = 0;
  if ((((pID_R->_M_string_length == 0) && (pID_G->_M_string_length == 0)) &&
      (pID_B->_M_string_length == 0)) && (pID_A->_M_string_length == 0)) goto LAB_003f4f00;
  local_b8[0] = local_a8;
  pcVar2 = (pID_R->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_b8,pcVar2,pcVar2 + pID_R->_M_string_length);
  std::__cxx11::string::append((char *)local_b8);
  plVar8 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_b8,(ulong)(pID_G->_M_dataplus)._M_p);
  plVar12 = plVar8 + 2;
  if ((long *)*plVar8 == plVar12) {
    local_40 = *plVar12;
    lStack_38 = plVar8[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar12;
    local_50 = (long *)*plVar8;
  }
  local_48 = plVar8[1];
  *plVar8 = (long)plVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_50);
  pCVar16 = (CAMFImporter_NodeElement_Texture *)(plVar8 + 2);
  if ((CAMFImporter_NodeElement_Texture *)*plVar8 == pCVar16) {
    local_88 = (pCVar16->super_CAMFImporter_NodeElement)._vptr_CAMFImporter_NodeElement;
    lStack_80 = plVar8[3];
    local_98 = (CAMFImporter_NodeElement_Texture *)&local_88;
  }
  else {
    local_88 = (pCVar16->super_CAMFImporter_NodeElement)._vptr_CAMFImporter_NodeElement;
    local_98 = (CAMFImporter_NodeElement_Texture *)*plVar8;
  }
  local_90 = plVar8[1];
  *plVar8 = (long)pCVar16;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_d0 = pID_G;
  local_c0 = pID_B;
  plVar8 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_98,(ulong)(pID_B->_M_dataplus)._M_p);
  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 == paVar13) {
    local_158._M_allocated_capacity = paVar13->_M_allocated_capacity;
    local_158._8_8_ = plVar8[3];
    local_168._M_p = (pointer)&local_158;
  }
  else {
    local_158._M_allocated_capacity = paVar13->_M_allocated_capacity;
    local_168._M_p = (pointer)*plVar8;
  }
  paStack_160 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)plVar8[1];
  *plVar8 = (long)paVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_168);
  local_188 = (CAMFImporter_NodeElement_Texture *)local_178;
  pCVar16 = (CAMFImporter_NodeElement_Texture *)(plVar8 + 2);
  if ((CAMFImporter_NodeElement_Texture *)*plVar8 == pCVar16) {
    local_178._0_8_ = (pCVar16->super_CAMFImporter_NodeElement)._vptr_CAMFImporter_NodeElement;
    local_178._8_8_ = plVar8[3];
  }
  else {
    local_178._0_8_ = (pCVar16->super_CAMFImporter_NodeElement)._vptr_CAMFImporter_NodeElement;
    local_188 = (CAMFImporter_NodeElement_Texture *)*plVar8;
  }
  local_180 = plVar8[1];
  *plVar8 = (long)pCVar16;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_c8 = pID_A;
  plVar8 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_188,(ulong)(pID_A->_M_dataplus)._M_p);
  paVar13 = &local_120.ID.field_2;
  puVar14 = (ulong *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar14) {
    local_120.ID.field_2._M_allocated_capacity = *puVar14;
    local_120.ID.field_2._8_8_ = plVar8[3];
    local_120.ID._M_dataplus._M_p = (pointer)paVar13;
  }
  else {
    local_120.ID.field_2._M_allocated_capacity = *puVar14;
    local_120.ID._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_120.ID._M_string_length = plVar8[1];
  pSVar17 = &local_120;
  *plVar8 = (long)puVar14;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_78,(string *)pSVar17);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120.ID._M_dataplus._M_p != paVar13) {
    operator_delete(local_120.ID._M_dataplus._M_p,
                    (ulong)(local_120.ID.field_2._M_allocated_capacity + 1));
  }
  if (local_188 != (CAMFImporter_NodeElement_Texture *)local_178) {
    operator_delete(local_188,local_178._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_p != &local_158) {
    operator_delete(local_168._M_p,local_158._M_allocated_capacity + 1);
  }
  if (local_98 != (CAMFImporter_NodeElement_Texture *)&local_88) {
    operator_delete(local_98,(long)local_88 + 1);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  if (local_b8[0] != local_a8) {
    operator_delete(local_b8[0],local_a8[0] + 1);
  }
  sVar6 = local_70;
  __s2 = local_78;
  plVar20 = (list<Assimp::AMFImporter::SPP_Texture,std::allocator<Assimp::AMFImporter::SPP_Texture>>
             *)&this->mTexture_Converted;
  pSVar24 = (SPP_Texture *)0xffffffffffffffff;
  local_128 = plVar20;
  do {
    plVar20 = *(list<Assimp::AMFImporter::SPP_Texture,std::allocator<Assimp::AMFImporter::SPP_Texture>>
                **)plVar20;
    if (plVar20 == local_128) {
      pSVar25 = (SPP_Texture *)((long)&(pSVar24->ID)._M_dataplus._M_p + 1);
      goto LAB_003f4938;
    }
    __n = *(size_t *)(plVar20 + 0x18);
    if (__n == sVar6) {
      if (__n == 0) {
        bVar26 = true;
      }
      else {
        iVar7 = bcmp(*(void **)(plVar20 + 0x10),__s2,__n);
        bVar26 = iVar7 == 0;
      }
    }
    else {
      bVar26 = false;
    }
    pSVar24 = (SPP_Texture *)((long)&(pSVar24->ID)._M_dataplus._M_p + 1);
  } while (!bVar26);
  pSVar25 = (SPP_Texture *)(pSVar24->FormatHint + ((ulong)(byte)(bVar26 + 1) - 0x39));
  pSVar17 = pSVar24;
LAB_003f4938:
  pID_01 = local_c0;
  pID_00 = local_c8;
  pID = local_d0;
  if (plVar20 == local_128) {
    local_168._M_p = (pointer)0x0;
    paStack_160 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
    pCVar16 = (CAMFImporter_NodeElement_Texture *)0x0;
    local_158._M_allocated_capacity = 0;
    local_120.ID._M_dataplus._M_p = (pointer)&local_120.ID.field_2;
    local_120.ID._M_string_length = 0;
    local_120.ID.field_2._M_allocated_capacity =
         local_120.ID.field_2._M_allocated_capacity & 0xffffffffffffff00;
    if (pID_R->_M_string_length != 0) {
      bVar26 = Find_NodeElement(this,pID_R,ENET_Texture,(CAMFImporter_NodeElement **)&local_188);
      if (!bVar26) {
        Throw_ID_NotFound(this,pID_R);
      }
      pCVar16 = local_188;
      local_98 = local_188;
      std::
      vector<CAMFImporter_NodeElement_Texture*,std::allocator<CAMFImporter_NodeElement_Texture*>>::
      emplace_back<CAMFImporter_NodeElement_Texture*>
                ((vector<CAMFImporter_NodeElement_Texture*,std::allocator<CAMFImporter_NodeElement_Texture*>>
                  *)&local_168,&local_98);
    }
    if (pID->_M_string_length == 0) {
      local_130 = (CAMFImporter_NodeElement_Texture *)0x0;
    }
    else {
      bVar26 = Find_NodeElement(this,pID,ENET_Texture,(CAMFImporter_NodeElement **)&local_188);
      if (!bVar26) {
        Throw_ID_NotFound(this,pID);
      }
      local_130 = local_188;
      local_98 = local_188;
      std::
      vector<CAMFImporter_NodeElement_Texture*,std::allocator<CAMFImporter_NodeElement_Texture*>>::
      emplace_back<CAMFImporter_NodeElement_Texture*>
                ((vector<CAMFImporter_NodeElement_Texture*,std::allocator<CAMFImporter_NodeElement_Texture*>>
                  *)&local_168,&local_98);
    }
    if (pID_01->_M_string_length == 0) {
      local_138 = (CAMFImporter_NodeElement_Texture *)0x0;
    }
    else {
      bVar26 = Find_NodeElement(this,pID_01,ENET_Texture,(CAMFImporter_NodeElement **)&local_188);
      if (!bVar26) {
        Throw_ID_NotFound(this,pID_01);
      }
      local_138 = local_188;
      local_98 = local_188;
      std::
      vector<CAMFImporter_NodeElement_Texture*,std::allocator<CAMFImporter_NodeElement_Texture*>>::
      emplace_back<CAMFImporter_NodeElement_Texture*>
                ((vector<CAMFImporter_NodeElement_Texture*,std::allocator<CAMFImporter_NodeElement_Texture*>>
                  *)&local_168,&local_98);
    }
    if (pID_00->_M_string_length == 0) {
      local_140 = (CAMFImporter_NodeElement_Texture *)0x0;
    }
    else {
      bVar26 = Find_NodeElement(this,pID_00,ENET_Texture,(CAMFImporter_NodeElement **)&local_188);
      if (!bVar26) {
        Throw_ID_NotFound(this,pID_00);
      }
      local_140 = local_188;
      local_98 = local_188;
      std::
      vector<CAMFImporter_NodeElement_Texture*,std::allocator<CAMFImporter_NodeElement_Texture*>>::
      emplace_back<CAMFImporter_NodeElement_Texture*>
                ((vector<CAMFImporter_NodeElement_Texture*,std::allocator<CAMFImporter_NodeElement_Texture*>>
                  *)&local_168,&local_98);
    }
    uVar15 = (long)paStack_160 - (long)local_168._M_p >> 3;
    if (1 < uVar15) {
      uVar19 = 1;
      while (uVar15 != uVar19) {
        lVar3 = *(long *)(local_168._M_p + uVar19 * 8 + -8);
        lVar4 = *(long *)(local_168._M_p + uVar19 * 8);
        if (((*(long *)(lVar3 + 0x50) != *(long *)(lVar4 + 0x50)) ||
            (*(long *)(lVar3 + 0x58) != *(long *)(lVar4 + 0x58))) ||
           (uVar19 = uVar19 + 1, *(long *)(lVar3 + 0x60) != *(long *)(lVar4 + 0x60))) {
          prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_188 = (CAMFImporter_NodeElement_Texture *)local_178;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_188,
                     "PostprocessHelper_GetTextureID_Or_Create. Source texture must has the same size."
                     ,"");
          std::runtime_error::runtime_error(prVar9,(string *)&local_188);
          *(undefined ***)prVar9 = &PTR__runtime_error_0082bce0;
          __cxa_throw(prVar9,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
      }
    }
    local_120.Width = *(undefined8 *)(*(size_type *)local_168._M_p + 0x50);
    local_120.Height = *(size_t *)(*(size_type *)local_168._M_p + 0x58);
    local_120.Depth = *(size_t *)(*(size_type *)local_168._M_p + 0x60);
    local_120.Tiled = false;
    if (paStack_160 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_p) {
      uVar19 = 0;
      local_120.Tiled = false;
      do {
        local_120.Tiled =
             (bool)(local_120.Tiled | *(byte *)(*(long *)(local_168._M_p + uVar19 * 8) + 0x80));
        uVar19 = uVar19 + 1;
      } while ((uVar19 & 0xff) < uVar15);
    }
    builtin_strncpy(local_120.FormatHint,"rgba0000",9);
    local_58 = pID_R->_M_string_length;
    if (local_58 != 0) {
      builtin_strncpy(local_120.FormatHint,"rgba8000",8);
    }
    if (pID->_M_string_length != 0) {
      local_120.FormatHint[5] = '8';
    }
    if (pID_01->_M_string_length != 0) {
      local_120.FormatHint[6] = '8';
    }
    if (pID_00->_M_string_length != 0) {
      local_120.FormatHint[7] = '8';
    }
    bVar26 = pCVar16 != (CAMFImporter_NodeElement_Texture *)0x0 && local_58 != 0;
    if (bVar26) {
      puVar22 = (pCVar16->Data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish +
                -(long)(pCVar16->Data).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
    }
    else {
      puVar22 = (pointer)0x0;
    }
    puVar23 = (pointer)(ulong)bVar26;
    puVar21 = puVar23;
    if (local_130 != (CAMFImporter_NodeElement_Texture *)0x0 && pID->_M_string_length != 0) {
      puVar22 = (local_130->Data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish +
                ((long)puVar22 -
                (long)(local_130->Data).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
      puVar21 = puVar23 + 1;
    }
    puVar18 = puVar21;
    if (local_138 != (CAMFImporter_NodeElement_Texture *)0x0 && pID_01->_M_string_length != 0) {
      puVar22 = (local_138->Data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish +
                ((long)puVar22 -
                (long)(local_138->Data).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
      puVar18 = puVar21 + 1;
    }
    if (local_140 != (CAMFImporter_NodeElement_Texture *)0x0 && pID_00->_M_string_length != 0) {
      puVar22 = (local_140->Data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish +
                ((long)puVar22 -
                (long)(local_140->Data).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
      puVar18 = puVar18 + 1;
    }
    local_120.Data = (uint8_t *)operator_new__((ulong)puVar22);
    if ((local_58 != 0) && (puVar22 != (pointer)0x0)) {
      if (pCVar16 == (CAMFImporter_NodeElement_Texture *)0x0) goto LAB_003f4f63;
      puVar10 = (pointer)0x0;
      uVar15 = 0;
      do {
        puVar5 = (pCVar16->Data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(pCVar16->Data).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)puVar5) <= uVar15)
        goto LAB_003f4ef2;
        local_120.Data[(long)puVar10] = puVar5[uVar15];
        puVar10 = puVar10 + (long)puVar18;
        uVar15 = uVar15 + 1;
      } while (puVar10 < puVar22);
    }
    if ((puVar23 < puVar22) && (local_d0->_M_string_length != 0)) {
      if (local_130 == (CAMFImporter_NodeElement_Texture *)0x0) goto LAB_003f4f63;
      uVar15 = 0;
      do {
        puVar10 = (local_130->Data).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((ulong)((long)(local_130->Data).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)puVar10) <= uVar15)
        goto LAB_003f4ef2;
        local_120.Data[(long)puVar23] = puVar10[uVar15];
        puVar23 = puVar23 + (long)puVar18;
        uVar15 = uVar15 + 1;
      } while (puVar23 < puVar22);
    }
    if ((local_c0->_M_string_length != 0) && (puVar21 < puVar22)) {
      if (local_138 == (CAMFImporter_NodeElement_Texture *)0x0) goto LAB_003f4f63;
      uVar15 = 0;
      do {
        puVar23 = (local_138->Data).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((ulong)((long)(local_138->Data).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)puVar23) <= uVar15)
        goto LAB_003f4ef2;
        local_120.Data[(long)puVar21] = puVar23[uVar15];
        puVar21 = puVar21 + (long)puVar18;
        uVar15 = uVar15 + 1;
      } while (puVar21 < puVar22);
    }
    if ((local_c8->_M_string_length != 0) && (puVar21 = puVar18 + -1, puVar21 < puVar22)) {
      if (local_140 == (CAMFImporter_NodeElement_Texture *)0x0) {
LAB_003f4f63:
        __assert_fail("tex",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/AMF/AMFImporter_Postprocess.cpp"
                      ,0x120,
                      "auto Assimp::AMFImporter::PostprocessHelper_GetTextureID_Or_Create(const std::string &, const std::string &, const std::string &, const std::string &)::(anonymous class)::operator()(const std::string &, const size_t, const size_t, const uint8_t) const"
                     );
      }
      uVar15 = 0;
      do {
        puVar23 = (local_140->Data).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((ulong)((long)(local_140->Data).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)puVar23) <= uVar15)
        goto LAB_003f4ef2;
        local_120.Data[(long)puVar21] = puVar23[uVar15];
        puVar21 = puVar21 + (long)puVar18;
        uVar15 = uVar15 + 1;
      } while (puVar21 < puVar22);
    }
    std::__cxx11::string::_M_assign((string *)&local_120);
    p_Var11 = std::__cxx11::
              list<Assimp::AMFImporter::SPP_Texture,std::allocator<Assimp::AMFImporter::SPP_Texture>>
              ::_M_create_node<Assimp::AMFImporter::SPP_Texture_const&>(local_128,&local_120);
    std::__detail::_List_node_base::_M_hook(&p_Var11->super__List_node_base);
    psVar1 = &(this->mTexture_Converted).
              super__List_base<Assimp::AMFImporter::SPP_Texture,_std::allocator<Assimp::AMFImporter::SPP_Texture>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120.ID._M_dataplus._M_p != &local_120.ID.field_2) {
      operator_delete(local_120.ID._M_dataplus._M_p,
                      (ulong)(local_120.ID.field_2._M_allocated_capacity + 1));
    }
    pSVar17 = pSVar25;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_168._M_p,local_158._M_allocated_capacity - (long)local_168._M_p);
    }
  }
  if (local_78 != &local_68) {
    operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
  }
  return (size_t)pSVar17;
LAB_003f4ef2:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_003f4f00:
  prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_120.ID._M_dataplus._M_p = (pointer)&local_120.ID.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_120,
             "PostprocessHelper_GetTextureID_Or_Create. At least one texture ID must be defined.",""
            );
  std::runtime_error::runtime_error(prVar9,(string *)&local_120);
  *(undefined ***)prVar9 = &PTR__runtime_error_0082bce0;
  __cxa_throw(prVar9,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

size_t AMFImporter::PostprocessHelper_GetTextureID_Or_Create(const std::string& pID_R, const std::string& pID_G, const std::string& pID_B,
																const std::string& pID_A)
{
    size_t TextureConverted_Index;
    std::string TextureConverted_ID;

	// check input data
	if(pID_R.empty() && pID_G.empty() && pID_B.empty() && pID_A.empty())
		throw DeadlyImportError("PostprocessHelper_GetTextureID_Or_Create. At least one texture ID must be defined.");

	// Create ID
	TextureConverted_ID = pID_R + "_" + pID_G + "_" + pID_B + "_" + pID_A;
	// Check if texture specified by set of IDs is converted already.
	TextureConverted_Index = 0;
	for(const SPP_Texture& tex_convd: mTexture_Converted)
	{
        if ( tex_convd.ID == TextureConverted_ID ) {
            return TextureConverted_Index;
        } else {
            ++TextureConverted_Index;
        }
	}

	//
	// Converted texture not found, create it.
	//
	CAMFImporter_NodeElement_Texture* src_texture[4]{nullptr};
	std::vector<CAMFImporter_NodeElement_Texture*> src_texture_4check;
	SPP_Texture converted_texture;

	{// find all specified source textures
		CAMFImporter_NodeElement* t_tex;

		// R
		if(!pID_R.empty())
		{
			if(!Find_NodeElement(pID_R, CAMFImporter_NodeElement::ENET_Texture, &t_tex)) Throw_ID_NotFound(pID_R);

			src_texture[0] = (CAMFImporter_NodeElement_Texture*)t_tex;
			src_texture_4check.push_back((CAMFImporter_NodeElement_Texture*)t_tex);
		}
		else
		{
			src_texture[0] = nullptr;
		}

		// G
		if(!pID_G.empty())
		{
			if(!Find_NodeElement(pID_G, CAMFImporter_NodeElement::ENET_Texture, &t_tex)) Throw_ID_NotFound(pID_G);

			src_texture[1] = (CAMFImporter_NodeElement_Texture*)t_tex;
			src_texture_4check.push_back((CAMFImporter_NodeElement_Texture*)t_tex);
		}
		else
		{
			src_texture[1] = nullptr;
		}

		// B
		if(!pID_B.empty())
		{
			if(!Find_NodeElement(pID_B, CAMFImporter_NodeElement::ENET_Texture, &t_tex)) Throw_ID_NotFound(pID_B);

			src_texture[2] = (CAMFImporter_NodeElement_Texture*)t_tex;
			src_texture_4check.push_back((CAMFImporter_NodeElement_Texture*)t_tex);
		}
		else
		{
			src_texture[2] = nullptr;
		}

		// A
		if(!pID_A.empty())
		{
			if(!Find_NodeElement(pID_A, CAMFImporter_NodeElement::ENET_Texture, &t_tex)) Throw_ID_NotFound(pID_A);

			src_texture[3] = (CAMFImporter_NodeElement_Texture*)t_tex;
			src_texture_4check.push_back((CAMFImporter_NodeElement_Texture*)t_tex);
		}
		else
		{
			src_texture[3] = nullptr;
		}
	}// END: find all specified source textures

	// check that all textures has same size
	if(src_texture_4check.size() > 1)
	{
		for (size_t i = 0, i_e = (src_texture_4check.size() - 1); i < i_e; i++)
		{
			if((src_texture_4check[i]->Width != src_texture_4check[i + 1]->Width) || (src_texture_4check[i]->Height != src_texture_4check[i + 1]->Height) ||
				(src_texture_4check[i]->Depth != src_texture_4check[i + 1]->Depth))
			{
				throw DeadlyImportError("PostprocessHelper_GetTextureID_Or_Create. Source texture must has the same size.");
			}
		}
	}// if(src_texture_4check.size() > 1)

	// set texture attributes
	converted_texture.Width = src_texture_4check[0]->Width;
	converted_texture.Height = src_texture_4check[0]->Height;
	converted_texture.Depth = src_texture_4check[0]->Depth;
	// if one of source texture is tiled then converted texture is tiled too.
	converted_texture.Tiled = false;
	for(uint8_t i = 0; i < src_texture_4check.size(); i++) converted_texture.Tiled |= src_texture_4check[i]->Tiled;

	// Create format hint.
	strcpy(converted_texture.FormatHint, "rgba0000");// copy initial string.
	if(!pID_R.empty()) converted_texture.FormatHint[4] = '8';
	if(!pID_G.empty()) converted_texture.FormatHint[5] = '8';
	if(!pID_B.empty()) converted_texture.FormatHint[6] = '8';
	if(!pID_A.empty()) converted_texture.FormatHint[7] = '8';

	//
	// Сopy data of textures.
	//
	size_t tex_size = 0;
	size_t step = 0;
	size_t off_g = 0;
	size_t off_b = 0;

	// Calculate size of the target array and rule how data will be copied.
    if(!pID_R.empty() && nullptr != src_texture[ 0 ] ) {
        tex_size += src_texture[0]->Data.size(); step++, off_g++, off_b++;
    }
    if(!pID_G.empty() && nullptr != src_texture[ 1 ] ) {
        tex_size += src_texture[1]->Data.size(); step++, off_b++;
    }
    if(!pID_B.empty() && nullptr != src_texture[ 2 ] ) {
        tex_size += src_texture[2]->Data.size(); step++;
    }
    if(!pID_A.empty() && nullptr != src_texture[ 3 ] ) {
        tex_size += src_texture[3]->Data.size(); step++;
    }

    // Create target array.
	converted_texture.Data = new uint8_t[tex_size];
	// And copy data
	auto CopyTextureData = [&](const std::string& pID, const size_t pOffset, const size_t pStep, const uint8_t pSrcTexNum) -> void
	{
		if(!pID.empty())
		{
			for(size_t idx_target = pOffset, idx_src = 0; idx_target < tex_size; idx_target += pStep, idx_src++) {
				CAMFImporter_NodeElement_Texture* tex = src_texture[pSrcTexNum];
				ai_assert(tex);
				converted_texture.Data[idx_target] = tex->Data.at(idx_src);
			}
		}
	};// auto CopyTextureData = [&](const size_t pOffset, const size_t pStep, const uint8_t pSrcTexNum) -> void

	CopyTextureData(pID_R, 0, step, 0);
	CopyTextureData(pID_G, off_g, step, 1);
	CopyTextureData(pID_B, off_b, step, 2);
	CopyTextureData(pID_A, step - 1, step, 3);

	// Store new converted texture ID
	converted_texture.ID = TextureConverted_ID;
	// Store new converted texture
	mTexture_Converted.push_back(converted_texture);

	return TextureConverted_Index;
}